

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.hpp
# Opt level: O1

autodiff_fvar<float,_1UL> __thiscall
anon_unknown.dwarf_650c3::func<float>::operator()(func<float> *this,float beta)

{
  autodiff_fvar<float,_1UL> aVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  array<float,_2UL> *paVar5;
  float *pfVar6;
  bool bVar7;
  float fVar8;
  promote<fvar<float,_1UL>,_fvar<float,_1UL>_> retval;
  array<float,_2UL> local_48;
  float local_40 [6];
  fvar<float,_1UL> local_28;
  fvar<float,_1UL> local_20;
  array<float,_2UL> local_18;
  
  fVar8 = this->Jx_ + this->Jx_;
  local_20.v._M_elems[1] = fVar8;
  local_20.v._M_elems[0] = fVar8 * beta;
  local_40[2] = beta;
  local_18._M_elems =
       (_Type)boost::math::differentiation::autodiff_v1::detail::sinh<float,1ul>(&local_20);
  pfVar6 = local_18._M_elems;
  fVar8 = this->Jy_ + this->Jy_;
  local_28.v._M_elems[1] = fVar8;
  local_28.v._M_elems[0] = local_40[2] * fVar8;
  local_48._M_elems =
       (_Type)boost::math::differentiation::autodiff_v1::detail::sinh<float,1ul>(&local_28);
  lVar3 = -1;
  lVar2 = 0;
  do {
    if ((array<float,_2UL> *)(local_40 + lVar3) == &local_48) {
      fVar8 = 0.0;
    }
    else {
      fVar8 = 0.0;
      lVar4 = 0;
      paVar5 = &local_48;
      do {
        fVar8 = fVar8 + paVar5->_M_elems[0] * *(float *)((long)pfVar6 + lVar4);
        paVar5 = (array<float,_2UL> *)((long)paVar5 + 4);
        lVar4 = lVar4 + -4;
      } while (lVar3 * -4 + -8 != lVar4);
    }
    local_40[lVar2] = fVar8;
    pfVar6 = pfVar6 + 1;
    lVar3 = 0;
    bVar7 = lVar2 == 0;
    lVar2 = lVar2 + 1;
  } while (bVar7);
  aVar1.v._M_elems[1] = SUB84(local_40._0_8_,4);
  aVar1.v._M_elems[0] = (float)local_40._0_8_ + -1.0;
  return (autodiff_fvar<float,_1UL>)aVar1.v._M_elems;
}

Assistant:

auto operator()(T beta) const -> decltype(boost::math::differentiation::make_fvar<T, 1>(beta)) {
    using std::sinh;
    auto beta_fvar = boost::math::differentiation::make_fvar<T, 1>(beta);
    return sinh(2 * Jx_ * beta_fvar) * sinh(2 * Jy_ * beta_fvar) - 1;
  }